

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O2

void kratos::add_generator_static_value(Module *m,string *name,string *value)

{
  Variable local_c8;
  undefined1 local_70 [8];
  Variable v;
  
  std::__cxx11::string::string((string *)local_70,(string *)name);
  std::__cxx11::string::string((string *)(v.name.field_2._M_local_buf + 8),(string *)value);
  v.value.field_2._M_local_buf[8] = '\0';
  v.id.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value._0_1_ = 0;
  hgdb::json::Variable::Variable(&local_c8,(Variable *)local_70);
  std::
  vector<std::variant<hgdb::json::Variable,_unsigned_long>,_std::allocator<std::variant<hgdb::json::Variable,_unsigned_long>_>_>
  ::emplace_back<hgdb::json::Variable>(&m->variables_,&local_c8);
  hgdb::json::Variable::~Variable(&local_c8);
  hgdb::json::Variable::~Variable((Variable *)local_70);
  return;
}

Assistant:

void add_generator_static_value(hgdb::json::Module &m, const std::string &name,
                                const std::string &value) {
    hgdb::json::Variable v{.name = name, .value = value, .rtl = false, .id = std::nullopt};
    m.add_variable(v);
}